

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::setTipPartials
          (BeagleCPUImpl<float,_1,_0> *this,int tipIndex,double *inPartials)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  float *pfVar17;
  double *pdVar18;
  float *pfVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  void *ptr;
  float *local_80;
  undefined1 local_78 [64];
  
  iVar14 = -5;
  if ((-1 < tipIndex) && (tipIndex < this->kTipCount)) {
    pfVar17 = this->gPartials[(uint)tipIndex];
    if (pfVar17 == (float *)0x0) {
      local_80 = (float *)0x0;
      posix_memalign(&local_80,0x20,(long)this->kPartialsSize << 2);
      this->gPartials[(uint)tipIndex] = local_80;
      pfVar17 = this->gPartials[(uint)tipIndex];
      if (pfVar17 == (float *)0x0) {
        return -2;
      }
    }
    iVar14 = this->kCategoryCount;
    if (0 < iVar14) {
      iVar2 = this->kPatternCount;
      iVar3 = this->kPartialsPaddedStateCount;
      uVar4 = this->kStateCount;
      lVar22 = (long)(int)uVar4;
      auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      iVar21 = 0;
      uVar16 = (this->kPaddedPatternCount - iVar2) * iVar3;
      auVar25 = vpbroadcastq_avx512f();
      local_78 = vmovdqu64_avx512f(auVar25);
      do {
        if (0 < iVar2) {
          iVar20 = 0;
          pdVar18 = inPartials;
          pfVar19 = pfVar17;
          do {
            if (uVar4 != 0) {
              uVar15 = 0;
              do {
                auVar26 = vpbroadcastq_avx512f();
                auVar26 = vporq_avx512f(auVar26,auVar24);
                uVar13 = vpcmpuq_avx512f(auVar26,auVar25,2);
                pdVar1 = pdVar18 + uVar15;
                auVar26._8_8_ = (ulong)((byte)(uVar13 >> 1) & 1) * (long)pdVar1[1];
                auVar26._0_8_ = (ulong)((byte)uVar13 & 1) * (long)*pdVar1;
                auVar26._16_8_ = (ulong)((byte)(uVar13 >> 2) & 1) * (long)pdVar1[2];
                auVar26._24_8_ = (ulong)((byte)(uVar13 >> 3) & 1) * (long)pdVar1[3];
                auVar26._32_8_ = (ulong)((byte)(uVar13 >> 4) & 1) * (long)pdVar1[4];
                auVar26._40_8_ = (ulong)((byte)(uVar13 >> 5) & 1) * (long)pdVar1[5];
                auVar26._48_8_ = (ulong)((byte)(uVar13 >> 6) & 1) * (long)pdVar1[6];
                auVar26._56_8_ = (uVar13 >> 7) * (long)pdVar1[7];
                auVar23 = vcvtpd2ps_avx512f(auVar26);
                pfVar17 = pfVar19 + uVar15;
                bVar5 = (bool)((byte)uVar13 & 1);
                bVar6 = (bool)((byte)(uVar13 >> 1) & 1);
                bVar7 = (bool)((byte)(uVar13 >> 2) & 1);
                bVar8 = (bool)((byte)(uVar13 >> 3) & 1);
                bVar9 = (bool)((byte)(uVar13 >> 4) & 1);
                bVar10 = (bool)((byte)(uVar13 >> 5) & 1);
                bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
                bVar12 = SUB81(uVar13 >> 7,0);
                *pfVar17 = (float)((uint)bVar5 * auVar23._0_4_ | (uint)!bVar5 * (int)*pfVar17);
                pfVar17[1] = (float)((uint)bVar6 * auVar23._4_4_ | (uint)!bVar6 * (int)pfVar17[1]);
                pfVar17[2] = (float)((uint)bVar7 * auVar23._8_4_ | (uint)!bVar7 * (int)pfVar17[2]);
                pfVar17[3] = (float)((uint)bVar8 * auVar23._12_4_ | (uint)!bVar8 * (int)pfVar17[3]);
                pfVar17[4] = (float)((uint)bVar9 * auVar23._16_4_ | (uint)!bVar9 * (int)pfVar17[4]);
                pfVar17[5] = (float)((uint)bVar10 * auVar23._20_4_ | (uint)!bVar10 * (int)pfVar17[5]
                                    );
                pfVar17[6] = (float)((uint)bVar11 * auVar23._24_4_ | (uint)!bVar11 * (int)pfVar17[6]
                                    );
                pfVar17[7] = (float)((uint)bVar12 * auVar23._28_4_ | (uint)!bVar12 * (int)pfVar17[7]
                                    );
                uVar15 = uVar15 + 8;
              } while (((ulong)uVar4 + 7 & 0xfffffffffffffff8) != uVar15);
            }
            pfVar17 = pfVar19 + lVar22;
            if ((int)uVar4 < iVar3) {
              memset(pfVar17,0,(ulong)(~uVar4 + iVar3) * 4 + 4);
              auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              auVar25 = vmovdqu64_avx512f(local_78);
              pfVar17 = pfVar19 + (ulong)(~uVar4 + iVar3) + lVar22 + 1;
            }
            pdVar18 = pdVar18 + lVar22;
            iVar20 = iVar20 + 1;
            pfVar19 = pfVar17;
          } while (iVar20 != iVar2);
        }
        if (0 < (int)uVar16) {
          memset(pfVar17,0,(ulong)uVar16 * 4);
          auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar25 = vmovdqu64_avx512f(local_78);
          pfVar17 = pfVar17 + (ulong)(uVar16 - 1) + 1;
        }
        iVar21 = iVar21 + 1;
      } while (iVar21 != iVar14);
    }
    iVar14 = 0;
  }
  return iVar14;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setTipPartials(int tipIndex,
                                  const double* inPartials) {
    if (tipIndex < 0 || tipIndex >= kTipCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    if(gPartials[tipIndex] == NULL) {
        gPartials[tipIndex] = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPartialsSize);
        // TODO: What if this throws a memory full error?
        if (gPartials[tipIndex] == 0L)
            return BEAGLE_ERROR_OUT_OF_MEMORY;
    }

    const double* inPartialsOffset;
    REALTYPE* tmpRealPartialsOffset = gPartials[tipIndex];
    for (int l = 0; l < kCategoryCount; l++) {
        inPartialsOffset = inPartials;
        for (int i = 0; i < kPatternCount; i++) {
            beagleMemCpy(tmpRealPartialsOffset, inPartialsOffset, kStateCount);
            tmpRealPartialsOffset += kStateCount;
            // Pad extra buffer with zeros
            for(int k = kStateCount; k < kPartialsPaddedStateCount; k++) {
                *tmpRealPartialsOffset++ = 0;
            }
            inPartialsOffset += kStateCount;
        }
        // Pad extra buffer with zeros
        for(int k = 0; k < kPartialsPaddedStateCount * (kPaddedPatternCount - kPatternCount); k++) {
            *tmpRealPartialsOffset++ = 0;
        }
    }

    return BEAGLE_SUCCESS;
}